

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS1::setCompassCTRL1(RTIMULSM9DS1 *this)

{
  uchar ctrl1;
  RTIMULSM9DS1 *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_LSM9DS1CompassSampleRate < 0) ||
     (5 < ((this->super_RTIMU).m_settings)->m_LSM9DS1CompassSampleRate)) {
    fprintf(_stderr,"Illegal LSM9DS1 compass sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1CompassSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_magSlaveAddr,
                            ' ',(uchar)(((this->super_RTIMU).m_settings)->m_LSM9DS1CompassSampleRate
                                       << 2),"Failed to set LSM9DS1 compass CTRL5");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS1::setCompassCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_LSM9DS1CompassSampleRate < 0) || (m_settings->m_LSM9DS1CompassSampleRate > 5)) {
        HAL_ERROR1("Illegal LSM9DS1 compass sample rate code %d\n", m_settings->m_LSM9DS1CompassSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_LSM9DS1CompassSampleRate << 2);

    return m_settings->HALWrite(m_magSlaveAddr, LSM9DS1_MAG_CTRL1, ctrl1, "Failed to set LSM9DS1 compass CTRL5");
}